

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

bool __thiscall bssl::DTLSMessageBitmap::Init(DTLSMessageBitmap *this,size_t num_bits)

{
  bool bVar1;
  
  if (num_bits < 0xfffffffffffffff9) {
    bVar1 = Array<unsigned_char>::Init(&this->bytes_,num_bits + 7 >> 3);
    if (bVar1) {
      MarkRange(this,num_bits,num_bits + 7 & 0xfffffffffffffff8);
      this->first_unmarked_byte_ = 0;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
    ERR_put_error(0x10,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x47);
  }
  return bVar1;
}

Assistant:

bool DTLSMessageBitmap::Init(size_t num_bits) {
  if (num_bits + 7 < num_bits) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }
  size_t num_bytes = (num_bits + 7) / 8;
  size_t bits_rounded = num_bytes * 8;
  if (!bytes_.Init(num_bytes)) {
    return false;
  }
  MarkRange(num_bits, bits_rounded);
  first_unmarked_byte_ = 0;
  return true;
}